

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wildcards.cpp
# Opt level: O3

int Wildcard::asterisk(char **wildcard,char **test)

{
  char cVar1;
  int iVar2;
  char cVar3;
  int iVar4;
  char *test_00;
  char *pcVar5;
  
  pcVar5 = *wildcard + 1;
  *wildcard = pcVar5;
  test_00 = *test;
  while (*test_00 != '\0') {
    cVar1 = *pcVar5;
    if (cVar1 != '*') {
      if (cVar1 != '?') {
        cVar3 = '\x01';
        goto LAB_002431d7;
      }
      *test = test_00 + 1;
      pcVar5 = *wildcard;
    }
    pcVar5 = pcVar5 + 1;
    *wildcard = pcVar5;
    test_00 = *test;
  }
  cVar1 = *pcVar5;
  iVar4 = 0;
  if (cVar1 == '*') {
    do {
      pcVar5 = pcVar5 + 1;
      *wildcard = pcVar5;
      cVar1 = *pcVar5;
    } while (cVar1 == '*');
    test_00 = *test;
    cVar3 = *test_00;
  }
  else {
    cVar3 = '\0';
  }
  if (cVar1 == '\0' || cVar3 != '\0') {
LAB_002431d7:
    if (cVar1 == '\0' && cVar3 == '\0') {
      iVar4 = 1;
    }
    else {
      iVar2 = wildcardfit(pcVar5,test_00);
      iVar4 = 1;
      while (iVar2 == 0) {
        pcVar5 = *test;
        do {
          pcVar5 = pcVar5 + 1;
          *test = pcVar5;
          cVar1 = *pcVar5;
          if ((cVar1 == '\0') || (cVar3 = **wildcard, cVar3 == '[')) break;
        } while (cVar3 != cVar1);
        if (cVar1 == '\0') {
          iVar4 = 0;
          break;
        }
        iVar2 = wildcardfit(*wildcard,pcVar5);
      }
      if ((**test == '\0') && (**wildcard == '\0')) {
        iVar4 = 1;
      }
    }
  }
  return iVar4;
}

Assistant:

int Wildcard::asterisk(const char** wildcard, const char** test) {
  /* Warning: uses multiple returns */
  int fit = 1;

  /* erase the leading asterisk */
  (*wildcard)++;
  while (('\000' != (**test)) && (('?' == **wildcard) || ('*' == **wildcard))) {
    if ('?' == **wildcard) (*test)++;
    (*wildcard)++;
  }
  /* Now it could be that test is empty and wildcard contains */
  /* aterisks. Then we delete them to get a proper state */
  while ('*' == (**wildcard))
    (*wildcard)++;

  if (('\0' == (**test)) && ('\0' != (**wildcard))) return (fit = 0);
  if (('\0' == (**test)) && ('\0' == (**wildcard)))
    return (fit = 1);
  else {
    /* Neither test nor wildcard are empty!          */
    /* the first character of wildcard isn't in [*?] */
    if (0 == wildcardfit(*wildcard, (*test))) {
      do {
        (*test)++;
        /* skip as much characters as possible in the teststring */
        /* stop if a character match occurs */
        while (((**wildcard) != (**test)) && ('[' != (**wildcard)) &&
               ('\0' != (**test)))
          (*test)++;
      } while ((('\0' != **test)) ? (0 == wildcardfit(*wildcard, (*test))) :
                                    (0 != (fit = 0)));
    }
    if (('\0' == **test) && ('\0' == **wildcard)) fit = 1;
    return (fit);
  }
}